

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O2

bool __thiscall ON_PolyEdgeCurve::ContainsAllEdges(ON_PolyEdgeCurve *this)

{
  int iVar1;
  int iVar2;
  ON_PolyEdgeSegment *pOVar3;
  int segment_index;
  int iVar4;
  
  iVar2 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
  iVar4 = 0;
  iVar1 = 0;
  if (0 < iVar2) {
    iVar4 = iVar2;
    iVar1 = 0;
  }
  while (segment_index = iVar1, iVar4 != segment_index) {
    pOVar3 = SegmentCurve(this,segment_index);
    if ((pOVar3 == (ON_PolyEdgeSegment *)0x0) ||
       (iVar1 = segment_index + 1, pOVar3->m_edge == (ON_BrepEdge *)0x0)) break;
  }
  return iVar2 <= segment_index;
}

Assistant:

bool ON_PolyEdgeCurve::ContainsAllEdges() const
{
  int i, count = SegmentCount();
  for( i = 0; i < count; i++)
  {
    ON_PolyEdgeSegment* segment = SegmentCurve(i);
    if( nullptr == segment || nullptr == segment->BrepEdge())
    {
      return false;
    }
  }
  return true;
}